

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_exception.hpp
# Opt level: O0

void __thiscall
duckdb::ParserException::ParserException<std::__cxx11::string>
          (ParserException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  string *in_RDX;
  ParserException *in_RDI;
  string local_58 [32];
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  string *msg_00;
  
  msg_00 = in_RDX;
  ::std::__cxx11::string::string(local_58,(string *)in_RDX);
  Exception::ConstructMessage<std::__cxx11::string>(msg_00,in_stack_ffffffffffffffe0);
  ParserException(in_RDI,in_RDX);
  ::std::__cxx11::string::~string(local_38);
  ::std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

explicit ParserException(const string &msg, ARGS... params) : ParserException(ConstructMessage(msg, params...)) {
	}